

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall common_log::set_file(common_log *this,char *path)

{
  FILE *pFVar1;
  char *in_RSI;
  common_log *in_RDI;
  common_log *in_stack_00000020;
  
  pause(in_RDI);
  if (in_RDI->file != (FILE *)0x0) {
    fclose((FILE *)in_RDI->file);
  }
  if (in_RSI == (char *)0x0) {
    in_RDI->file = (FILE *)0x0;
  }
  else {
    pFVar1 = fopen(in_RSI,"w");
    in_RDI->file = (FILE *)pFVar1;
  }
  resume(in_stack_00000020);
  return;
}

Assistant:

void set_file(const char * path) {
        pause();

        if (file) {
            fclose(file);
        }

        if (path) {
            file = fopen(path, "w");
        } else {
            file = nullptr;
        }

        resume();
    }